

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O3

sat_solver *
Sbd_ManSatSolver(sat_solver *pSat,Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fQbf)

{
  int iVar2;
  uint uVar3;
  ulong uVar4;
  lit *begin;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int iVar1;
  long lVar8;
  int iVar0;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  int iLit;
  int pLits [2];
  int in_stack_ffffffffffffff88;
  lit local_54;
  Gia_Man_t *local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  uint local_38;
  uint local_34;
  
  local_54 = 1;
  if ((Pivot < 0) || (vObj2Var->nSize <= Pivot)) {
LAB_00549d74:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar13 = vWinObjs->nSize;
  iVar15 = vTfo->nSize;
  iVar2 = vObj2Var->pArray[(uint)Pivot];
  local_48 = (ulong)(uint)(iVar13 + iVar15 + vRoots->nSize);
  local_40 = vMirrors;
  if (pSat == (sat_solver *)0x0) {
    pSat = sat_solver_new();
  }
  else {
    sat_solver_restart(pSat);
  }
  sat_solver_setnvars(pSat,vRoots->nSize + vWinObjs->nSize + vTfo->nSize + 100);
  sat_solver_addclause(pSat,&local_54,(lit *)&local_50);
  iVar11 = vWinObjs->nSize;
  local_50 = p;
  if (1 < iVar11) {
    lVar9 = 1;
    do {
      iVar11 = vWinObjs->pArray[lVar9];
      lVar8 = (long)iVar11;
      if ((lVar8 < 0) || (p->nObjs <= iVar11)) goto LAB_00549d93;
      uVar10 = *(ulong *)(p->pObjs + lVar8);
      uVar6 = (uint)uVar10;
      if ((~uVar6 & 0x9fffffff) != 0) {
        if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0x4e,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        uVar12 = local_40->nSize;
        if ((int)uVar12 <= iVar11) goto LAB_00549d74;
        piVar7 = local_40->pArray;
        if (-1 < piVar7[lVar8]) {
          __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0x4f,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        uVar14 = vObj2Var->nSize;
        if ((int)uVar14 <= iVar11) goto LAB_00549d74;
        uVar18 = iVar11 - (uVar6 & 0x1fffffff);
        if (((int)uVar18 < 0) || (uVar12 <= uVar18)) goto LAB_00549d74;
        uVar19 = (uint)(uVar10 >> 0x20);
        uVar16 = uVar19 & 0x1fffffff;
        uVar20 = iVar11 - uVar16;
        if (((int)uVar20 < 0) || (uVar12 <= uVar20)) goto LAB_00549d74;
        uVar12 = piVar7[uVar18];
        uVar21 = piVar7[uVar20];
        uVar3 = uVar12 >> 1;
        if ((int)uVar12 < 0) {
          uVar3 = uVar18;
        }
        uVar18 = uVar21 >> 1;
        if ((int)uVar21 < 0) {
          uVar18 = uVar20;
        }
        if ((uVar14 <= uVar3) || (uVar14 <= uVar18)) goto LAB_00549d74;
        piVar7 = vObj2Var->pArray;
        uVar12 = ~uVar12 >> 0x1f & uVar12 ^ (uint)(uVar10 >> 0x1d) & 1;
        uVar14 = ~uVar21 >> 0x1f & uVar21 ^ uVar19 >> 0x1d & 1;
        if ((uVar6 & 0x1fffffff) < uVar16) {
          sat_solver_add_xor(pSat,piVar7[lVar8],piVar7[uVar3],piVar7[uVar18],uVar14 ^ uVar12);
          p = local_50;
        }
        else {
          sat_solver_add_and(pSat,piVar7[lVar8],piVar7[uVar3],piVar7[uVar18],uVar12,uVar14,
                             in_stack_ffffffffffffff88);
          p = local_50;
        }
      }
      lVar9 = lVar9 + 1;
      iVar11 = vWinObjs->nSize;
    } while (lVar9 < iVar11);
  }
  uVar6 = iVar13 - iVar15;
  uVar10 = (ulong)uVar6;
  if ((int)uVar6 < iVar11) {
    do {
      if ((int)uVar6 < 0) goto LAB_00549d74;
      iVar13 = vWinObjs->pArray[uVar10];
      lVar9 = (long)iVar13;
      if ((lVar9 < 0) || (p->nObjs <= iVar13)) {
LAB_00549d93:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = *(ulong *)(p->pObjs + lVar9);
      uVar12 = (uint)uVar4;
      if (((int)uVar12 < 0) || ((uVar12 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,0x62,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      uVar14 = local_40->nSize;
      if ((int)uVar14 <= iVar13) goto LAB_00549d74;
      piVar7 = local_40->pArray;
      if (-1 < piVar7[lVar9]) {
        __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,99,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      uVar18 = vObj2Var->nSize;
      if ((int)uVar18 <= iVar13) goto LAB_00549d74;
      uVar19 = iVar13 - (uVar12 & 0x1fffffff);
      if (((int)uVar19 < 0) || (uVar14 <= uVar19)) goto LAB_00549d74;
      uVar20 = (uint)(uVar4 >> 0x20);
      uVar16 = uVar20 & 0x1fffffff;
      uVar21 = iVar13 - uVar16;
      if (((int)uVar21 < 0) || (uVar14 <= uVar21)) goto LAB_00549d74;
      uVar14 = piVar7[uVar19];
      uVar3 = piVar7[uVar21];
      uVar5 = uVar14 >> 1;
      if ((int)uVar14 < 0) {
        uVar5 = uVar19;
      }
      uVar19 = uVar3 >> 1;
      if ((int)uVar3 < 0) {
        uVar19 = uVar21;
      }
      if ((uVar18 <= uVar5) || (uVar18 <= uVar19)) goto LAB_00549d74;
      piVar7 = vObj2Var->pArray;
      iVar13 = vTfo->nSize;
      iVar11 = piVar7[lVar9] + iVar13;
      iVar15 = iVar13;
      if (piVar7[uVar5] < (int)uVar6) {
        iVar15 = 0;
      }
      iVar15 = iVar15 + piVar7[uVar5];
      if (piVar7[uVar19] < (int)uVar6) {
        iVar13 = 0;
      }
      iVar13 = iVar13 + piVar7[uVar19];
      iVar0 = iVar15;
      if (iVar15 == iVar2) {
        iVar0 = (int)local_48;
      }
      iVar1 = iVar13;
      if (iVar13 == iVar2) {
        iVar1 = (int)local_48;
      }
      bVar22 = fQbf == 0;
      if (bVar22) {
        iVar1 = iVar13;
        iVar0 = iVar15;
      }
      uVar14 = ~uVar14 >> 0x1f & uVar14 ^ (uint)(uVar4 >> 0x1d) & 1 ^
               (uint)(iVar0 == iVar2 && bVar22);
      uVar18 = ~uVar3 >> 0x1f & uVar3 ^ uVar20 >> 0x1d & 1 ^ (uint)(iVar1 == iVar2 && bVar22);
      if ((uVar12 & 0x1fffffff) < uVar16) {
        sat_solver_add_xor(pSat,iVar11,iVar0,iVar1,uVar18 ^ uVar14);
      }
      else {
        sat_solver_add_and(pSat,iVar11,iVar0,iVar1,uVar14,uVar18,in_stack_ffffffffffffff88);
      }
      uVar10 = uVar10 + 1;
      iVar11 = vWinObjs->nSize;
      p = local_50;
    } while ((int)uVar10 < iVar11);
  }
  uVar6 = vRoots->nSize;
  if ((int)uVar6 < 1) {
    if (fQbf != 0) {
      if (iVar2 < 0) {
LAB_00549db2:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar13 = (int)local_48;
      uVar6 = 0;
      bVar22 = true;
      do {
        bVar17 = bVar22;
        local_38 = uVar6 | iVar2 * 2;
        if ((int)local_48 < 0) goto LAB_00549db2;
        local_34 = uVar6 | iVar13 * 2;
        iVar15 = sat_solver_addclause(pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0);
        if (iVar15 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0x97,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        uVar6 = 1;
        bVar22 = false;
      } while (bVar17);
    }
  }
  else {
    iVar11 = iVar11 + vTfo->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    uVar10 = 0x10;
    if (0x10 < uVar6) {
      uVar10 = (ulong)uVar6;
    }
    p_00->nSize = 0;
    p_00->nCap = (int)uVar10;
    piVar7 = (int *)malloc(uVar10 << 2);
    p_00->pArray = piVar7;
    iVar13 = iVar11 * 2;
    lVar9 = 0;
    do {
      iVar15 = vRoots->pArray[lVar9];
      lVar8 = (long)iVar15;
      if ((lVar8 < 0) || (local_40->nSize <= iVar15)) goto LAB_00549d74;
      if (-1 < local_40->pArray[lVar8]) {
        __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,0x80,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if (vObj2Var->nSize <= iVar15) goto LAB_00549d74;
      if (iVar11 < 0) goto LAB_00549db2;
      iVar15 = vObj2Var->pArray[lVar8];
      Vec_IntPush(p_00,iVar13);
      sat_solver_add_xor(pSat,iVar15,vTfo->nSize + iVar15,iVar11 + (int)lVar9,0);
      lVar9 = lVar9 + 1;
      iVar13 = iVar13 + 2;
    } while (lVar9 < vRoots->nSize);
    begin = p_00->pArray;
    iVar13 = sat_solver_addclause(pSat,begin,begin + p_00->nSize);
    if (begin != (lit *)0x0) {
      free(begin);
    }
    free(p_00);
    if (iVar13 == 0) goto LAB_00549d57;
    iVar13 = sat_solver_nvars(pSat);
    if ((iVar13 - iVar11) + -100 != (int)lVar9) {
      __assert_fail("sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0x8d,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
  }
  iVar13 = sat_solver_simplify(pSat);
  if (iVar13 != 0) {
    return pSat;
  }
LAB_00549d57:
  sat_solver_delete(pSat);
  return (sat_solver *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs SAT solver for the window.]

  Description [The window for the pivot node (Pivot) is represented as
  a DFS ordered array of objects (vWinObjs) whose indexed in the array
  (which will be used as SAT variables) are given in array vObj2Var.
  The TFO nodes are listed as the last ones in vWinObjs. The root nodes
  are labeled with Abc_LitIsCompl() in vTfo and also given in vRoots.
  If fQbf is 1, returns the instance meant for QBF solving. It is using
  the last variable (LastVar) as the placeholder for the second copy
  of the pivot node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, 
                               int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                               Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf )
{
    Gia_Obj_t * pObj;
    int i, iLit = 1, iObj, Fan0, Fan1, Lit0m, Lit1m, Node, fCompl0, fCompl1, RetValue;
    int TfoStart = Vec_IntSize(vWinObjs) - Vec_IntSize(vTfo);
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int LastVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    //Vec_IntPrint( vWinObjs );
    //Vec_IntPrint( vTfo );
    //Vec_IntPrint( vRoots );
    // create SAT solver
    if ( pSat == NULL )
        pSat = sat_solver_new();
    else
        sat_solver_restart( pSat );
    sat_solver_setnvars( pSat, Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots) + SBD_FVAR_MAX );
    // create constant 0 clause
    sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    // add clauses for all nodes
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, 1 )
    {
        pObj = Gia_ManObj( p, iObj );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, TfoStart )
    {
        pObj = Gia_ManObj( p, iObj );
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj ) + Vec_IntSize(vTfo);
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        Fan0 = Fan0 < TfoStart ? Fan0 : Fan0 + Vec_IntSize(vTfo);
        Fan1 = Fan1 < TfoStart ? Fan1 : Fan1 + Vec_IntSize(vTfo);
        if ( fQbf )
        {
            Fan0 = Fan0 == PivotVar ? LastVar : Fan0;
            Fan1 = Fan1 == PivotVar ? LastVar : Fan1;
        }
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (!fQbf && Fan0 == PivotVar) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (!fQbf && Fan1 == PivotVar) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    if ( Vec_IntSize(vRoots) > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo);
        Vec_Int_t * vFaninVars = Vec_IntAlloc( Vec_IntSize(vRoots) );
        Vec_IntForEachEntry( vRoots, iObj, i )
        {
            assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
            Node = Vec_IntEntry( vObj2Var, iObj );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars, 0) );
            sat_solver_add_xor( pSat, Node, Node + Vec_IntSize(vTfo), nVars++, 0 );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vFaninVars), Vec_IntLimit(vFaninVars) );
        Vec_IntFree( vFaninVars );
        if ( RetValue == 0 )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
        assert( sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX );
    }
    else if ( fQbf )
    {
        int n, pLits[2];
        for ( n = 0; n < 2; n++ )
        {
            pLits[0] = Abc_Var2Lit( PivotVar, n );
            pLits[1] = Abc_Var2Lit( LastVar, n );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( RetValue == 0 )
    {
        sat_solver_delete( pSat );
        return NULL;    
    }
    return pSat;
}